

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItem::update(QGraphicsItem *this,QRectF *rect)

{
  bool bVar1;
  QGraphicsItemPrivate *pQVar2;
  QGraphicsItemCache *pQVar3;
  QRectF *in_RSI;
  long in_RDI;
  QGraphicsItemPrivate *unaff_retaddr;
  bool in_stack_0000001b;
  bool in_stack_0000001c;
  bool in_stack_0000001d;
  bool in_stack_0000001e;
  bool in_stack_0000001f;
  QGraphicsItemCache *cache;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  bVar1 = QRectF::isEmpty(in_RSI);
  if ((!bVar1) || (bVar1 = QRectF::isNull(in_RSI), bVar1)) {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )(in_RDI + 8));
    QGraphicsItemPrivate::invalidateParentGraphicsEffectsRecursively
              ((QGraphicsItemPrivate *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
              );
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 8));
    if ((*(ulong *)&pQVar2->field_0x160 >> 0x15 & 3) != 0) {
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                  *)(in_RDI + 8));
      pQVar3 = QGraphicsItemPrivate::extraItemCache(unaff_retaddr);
      if ((pQVar3->allExposed & 1U) == 0) {
        bVar1 = QRectF::isNull(in_RSI);
        if (bVar1) {
          pQVar3->allExposed = true;
          QList<QRectF>::clear
                    ((QList<QRectF> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
          ;
        }
        else {
          QList<QRectF>::append
                    ((QList<QRectF> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (parameter_type)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
      }
      pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)(in_RDI + 8));
      if ((*(ulong *)&pQVar2->field_0x160 >> 0x1f & 1) != 0) {
        return;
      }
    }
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 8));
    if (pQVar2->scene != (QGraphicsScene *)0x0) {
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                  *)(in_RDI + 8));
      QGraphicsScene::d_func((QGraphicsScene *)0x97a237);
      QGraphicsScenePrivate::markDirty
                ((QGraphicsScenePrivate *)this,(QGraphicsItem *)rect,(QRectF *)cache,
                 in_stack_0000001f,in_stack_0000001e,in_stack_0000001d,in_stack_0000001c,
                 in_stack_0000001b);
    }
  }
  return;
}

Assistant:

void QGraphicsItem::update(const QRectF &rect)
{
    if (rect.isEmpty() && !rect.isNull())
        return;

    // Make sure we notify effects about invalidated source.
#if QT_CONFIG(graphicseffect)
    d_ptr->invalidateParentGraphicsEffectsRecursively();
#endif // QT_CONFIG(graphicseffect)

    if (CacheMode(d_ptr->cacheMode) != NoCache) {
        // Invalidate cache.
        QGraphicsItemCache *cache = d_ptr->extraItemCache();
        if (!cache->allExposed) {
            if (rect.isNull()) {
                cache->allExposed = true;
                cache->exposed.clear();
            } else {
                cache->exposed.append(rect);
            }
        }
        // Only invalidate cache; item is already dirty.
        if (d_ptr->fullUpdatePending)
            return;
    }

    if (d_ptr->scene)
        d_ptr->scene->d_func()->markDirty(this, rect);
}